

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-trapezoid-tessellator.cpp
# Opt level: O0

bool __thiscall
gepard::SegmentApproximator::curveIsLineSegment(SegmentApproximator *this,FloatPoint *points)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double local_90;
  Float maxY;
  Float maxX;
  Float minY;
  Float minX;
  Float dt2;
  Float dt1;
  Float y3;
  Float x3;
  Float y2;
  Float x2;
  Float y1;
  Float x1;
  Float y0;
  Float x0;
  FloatPoint *points_local;
  SegmentApproximator *this_local;
  
  dVar1 = points->x;
  dVar2 = points->y;
  dVar3 = points[1].x;
  dVar4 = points[1].y;
  dVar5 = points[2].x;
  dVar6 = points[2].y;
  dVar7 = points[3].x;
  local_90 = points[3].y;
  dVar9 = ABS((dVar7 - dVar1) * (dVar2 - dVar4) + -((dVar1 - dVar3) * (local_90 - dVar2)));
  dVar10 = ABS((dVar7 - dVar1) * (dVar2 - dVar6) + -((dVar1 - dVar5) * (local_90 - dVar2)));
  if ((this->kTolerance <= dVar9 && dVar9 != this->kTolerance) ||
     (this->kTolerance <= dVar10 && dVar10 != this->kTolerance)) {
    this_local._7_1_ = false;
  }
  else {
    if (dVar7 <= dVar1) {
      minY = dVar7 - this->kTolerance;
      maxY = dVar1 + this->kTolerance;
    }
    else {
      minY = dVar1 - this->kTolerance;
      maxY = dVar7 + this->kTolerance;
    }
    if (local_90 <= dVar2) {
      maxX = local_90 - this->kTolerance;
      local_90 = dVar2 + this->kTolerance;
    }
    else {
      maxX = dVar2 - this->kTolerance;
      local_90 = local_90 + this->kTolerance;
    }
    bVar8 = true;
    if ((((minY <= dVar3) && (bVar8 = true, dVar3 <= maxY)) && (bVar8 = true, maxX <= dVar4)) &&
       (((bVar8 = true, dVar4 <= local_90 && (bVar8 = true, minY <= dVar5)) &&
        ((bVar8 = true, dVar5 <= maxY && (bVar8 = true, maxX <= dVar6)))))) {
      bVar8 = local_90 < dVar6;
    }
    this_local._7_1_ = (bool)(bVar8 ^ 1);
  }
  return this_local._7_1_;
}

Assistant:

const bool SegmentApproximator::curveIsLineSegment(FloatPoint points[])
{
    const Float x0 = points[0].x;
    const Float y0 = points[0].y;
    const Float x1 = points[1].x;
    const Float y1 = points[1].y;
    const Float x2 = points[2].x;
    const Float y2 = points[2].y;
    const Float x3 = points[3].x;
    const Float y3 = points[3].y;

    const Float dt1 = std::fabs((x3 - x0) * (y0 - y1) - (x0 - x1) * (y3 - y0));
    const Float dt2 = std::fabs((x3 - x0) * (y0 - y2) - (x0 - x2) * (y3 - y0));

    if (dt1 > kTolerance || dt2 > kTolerance)
        return false;

    Float minX, minY, maxX, maxY;

    if (x0 < x3) {
        minX = x0 - kTolerance;
        maxX = x3 + kTolerance;
    } else {
        minX = x3 - kTolerance;
        maxX = x0 + kTolerance;
    }

    if (y0 < y3) {
        minY = y0 - kTolerance;
        maxY = y3 + kTolerance;
    } else {
        minY = y3 - kTolerance;
        maxY = y0 + kTolerance;
    }

    return !(x1 < minX || x1 > maxX || y1 < minY || y1 > maxY
             || x2 < minX || x2 > maxX || y2 < minY || y2 > maxY);
}